

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O1

ssize_t __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::write(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
        *this,int __fd,void *__buf,size_t __n)

{
  uint8_t *puVar1;
  HalfCycles *pHVar2;
  VIAPortHandler *pVVar3;
  byte bVar4;
  uint uVar5;
  uint *puVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar7;
  ssize_t extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  ulong uVar8;
  uint *extraout_RAX_04;
  uint *extraout_RAX_05;
  ssize_t extraout_RAX_06;
  char cVar10;
  uint uVar11;
  LineState value;
  Port port;
  long lVar12;
  bool bVar13;
  undefined7 uVar9;
  
  uVar11 = (uint)__buf;
  bVar4 = (byte)__buf;
  access(this,(char *)(ulong)(__fd & 0xfU),uVar11);
  puVar6 = &switchD_002dbd5c::switchdataD_004bdfb0;
  uVar9 = 0x4bdf;
  switch(__fd & 0xfU) {
  case 0:
    (this->super_MOS6522Storage).registers_.output[1] = bVar4;
    pVVar3 = this->bus_handler_;
    lVar12 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
    (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
    pHVar2 = &pVVar3->audio_->time_since_update;
    (pHVar2->super_WrappedInt<HalfCycles>).length_ =
         (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar12 * 5;
    bVar4 = (this->super_MOS6522Storage).registers_.auxiliary_control & 0x80;
    Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler
    ::set_port_output(pVVar3,B,(this->super_MOS6522Storage).registers_.output[1] | bVar4,
                      bVar4 | (this->super_MOS6522Storage).registers_.data_direction[1]);
    uVar8 = CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),
                     (this->super_MOS6522Storage).registers_.peripheral_control >> 2) &
            0xffffffffffffff08;
    uVar9 = (undefined7)(uVar8 >> 8);
    bVar4 = ((byte)uVar8 | 0xe7) & (this->super_MOS6522Storage).registers_.interrupt_flags;
    cVar10 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4;
    bVar13 = (bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x6f) == 0;
    goto LAB_002dbffb;
  default:
    (this->super_MOS6522Storage).registers_.output[0] = bVar4;
    pVVar3 = this->bus_handler_;
    lVar12 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
    (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
    pHVar2 = &pVVar3->audio_->time_since_update;
    (pHVar2->super_WrappedInt<HalfCycles>).length_ =
         (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar12 * 5;
    Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler
    ::set_port_output(pVVar3,A,bVar4,(this->super_MOS6522Storage).registers_.data_direction[0]);
    uVar7 = extraout_RAX;
    if ((this->super_MOS6522Storage).handshake_modes_[1] != None) {
      set_control_line_output(this,A,Two,Off);
      uVar7 = extraout_RAX_00;
    }
    uVar9 = (undefined7)((ulong)uVar7 >> 8);
    bVar4 = ((this->super_MOS6522Storage).registers_.peripheral_control << 2 | 0xf5) &
            (this->super_MOS6522Storage).registers_.interrupt_flags;
    cVar10 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4;
    bVar13 = (bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7d) == 0;
    goto LAB_002dbffb;
  case 2:
    (this->super_MOS6522Storage).registers_.data_direction[1] = bVar4;
    break;
  case 3:
    (this->super_MOS6522Storage).registers_.data_direction[0] = bVar4;
    break;
  case 4:
  case 6:
    *(byte *)(this->super_MOS6522Storage).registers_.timer_latch = bVar4;
    break;
  case 5:
    uVar7 = 0;
    uVar11 = (uVar11 & 0xff) << 8 |
             (uint)(byte)(this->super_MOS6522Storage).registers_.timer_latch[0];
    (this->super_MOS6522Storage).registers_.timer_latch[0] = (uint16_t)uVar11;
    (this->super_MOS6522Storage).registers_.next_timer[0] = uVar11;
    (this->super_MOS6522Storage).timer_is_running_[0] = true;
    if ((char)(this->super_MOS6522Storage).registers_.auxiliary_control < '\0') {
      puVar1 = &(this->super_MOS6522Storage).registers_.timer_port_b_output;
      *puVar1 = *puVar1 & 0x7f;
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::
      VIAPortHandler::set_port_output
                (this->bus_handler_,B,(this->super_MOS6522Storage).registers_.output[1] | 0x80,
                 (this->super_MOS6522Storage).registers_.data_direction[1] | 0x80);
      uVar7 = extraout_RAX_02;
    }
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    uVar9 = (undefined7)((ulong)uVar7 >> 8);
    cVar10 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4 & 0xbf;
    bVar13 = (bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x3f) == 0;
    goto LAB_002dbffb;
  case 7:
    *(byte *)((long)(this->super_MOS6522Storage).registers_.timer_latch + 1) = bVar4;
    break;
  case 8:
    puVar6 = (uint *)((ulong)__buf & 0xff);
    (this->super_MOS6522Storage).registers_.timer_latch[1] = (uint16_t)puVar6;
    break;
  case 9:
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    cVar10 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4 & 0xdf;
    (this->super_MOS6522Storage).registers_.next_timer[1] =
         (uVar11 & 0xff) << 8 | (uint)(this->super_MOS6522Storage).registers_.timer_latch[1];
    (this->super_MOS6522Storage).timer_is_running_[1] = true;
    uVar9 = 0x4bdf;
    bVar13 = (bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x5f) == 0;
    goto LAB_002dbffb;
  case 10:
    (this->super_MOS6522Storage).registers_.shift = bVar4;
    (this->super_MOS6522Storage).shift_bits_remaining_ = 8;
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags;
    cVar10 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4 & 0xfb;
    bVar13 = (bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7b) == 0;
LAB_002dbffb:
    puVar6 = (uint *)CONCAT71(uVar9,!bVar13);
    if ((bool)cVar10 != !bVar13) {
LAB_002dc027:
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = SUB81(puVar6,0);
      pVVar3 = this->bus_handler_;
      lVar12 = (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      pHVar2 = &pVVar3->audio_->time_since_update;
      (pHVar2->super_WrappedInt<HalfCycles>).length_ =
           (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar12 * 5;
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::
      update_interrupt_input(pVVar3->machine_);
      return extraout_RAX_06;
    }
    break;
  case 0xb:
    (this->super_MOS6522Storage).registers_.auxiliary_control = bVar4;
    evaluate_cb2_output(this);
    bVar4 = (this->super_MOS6522Storage).registers_.auxiliary_control;
    if (-1 < (char)bVar4) {
      puVar1 = &(this->super_MOS6522Storage).registers_.timer_port_b_output;
      *puVar1 = *puVar1 | 0x80;
    }
    bVar4 = bVar4 & 0x80;
    Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler
    ::set_port_output(this->bus_handler_,B,(this->super_MOS6522Storage).registers_.output[1] | bVar4
                      ,bVar4 | (this->super_MOS6522Storage).registers_.data_direction[1]);
    return extraout_RAX_01;
  case 0xc:
    (this->super_MOS6522Storage).registers_.peripheral_control = bVar4;
    port = A;
    lVar12 = 0;
    do {
      *(undefined4 *)((long)(this->super_MOS6522Storage).handshake_modes_ + lVar12) = 0;
      uVar5 = (uVar11 & 0xff) >> ((byte)lVar12 & 0x1f) & 0xe;
      puVar6 = (uint *)((long)&switchD_002dbf5f::switchdataD_004bdff0 +
                       (long)(int)(&switchD_002dbf5f::switchdataD_004bdff0)[uVar5]);
      switch(uVar5) {
      default:
        if (lVar12 == 4) {
          (this->super_MOS6522Storage).control_outputs_[1].lines[1] = Input;
          evaluate_cb2_output(this);
          puVar6 = extraout_RAX_04;
        }
        else if (*(int *)((long)(this->super_MOS6522Storage).control_outputs_[0].lines +
                         lVar12 * 2 + 4) != 2) {
          *(undefined4 *)
           ((long)(this->super_MOS6522Storage).control_outputs_[0].lines + lVar12 * 2 + 4) = 2;
        }
        goto LAB_002dbfc1;
      case 8:
        *(undefined4 *)((long)(this->super_MOS6522Storage).handshake_modes_ + lVar12) = 1;
      case 0xc:
        value = Off;
        break;
      case 10:
        *(undefined4 *)((long)(this->super_MOS6522Storage).handshake_modes_ + lVar12) = 2;
      case 0xe:
        value = On;
      }
      set_control_line_output(this,port,Two,value);
      puVar6 = extraout_RAX_05;
LAB_002dbfc1:
      lVar12 = lVar12 + 4;
      port = port + B;
    } while (lVar12 == 4);
    break;
  case 0xd:
    bVar4 = ~bVar4 & (this->super_MOS6522Storage).registers_.interrupt_flags;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4;
    bVar4 = bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable;
    goto LAB_002dc016;
  case 0xe:
    if ((char)bVar4 < '\0') {
      puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_enable;
      *puVar1 = *puVar1 | bVar4;
    }
    else {
      puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_enable;
      *puVar1 = *puVar1 & ~bVar4;
    }
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags &
            (this->super_MOS6522Storage).registers_.interrupt_enable;
    puVar6 = (uint *)CONCAT71(0x4bdf,bVar4);
LAB_002dc016:
    bVar13 = (bVar4 & 0x7f) != 0;
    puVar6 = (uint *)CONCAT71((int7)((ulong)puVar6 >> 8),bVar13);
    if ((this->super_MOS6522Storage).last_posted_interrupt_status_ == bVar13) {
      return (ssize_t)puVar6;
    }
    goto LAB_002dc027;
  }
  return (ssize_t)puVar6;
}

Assistant:

void MOS6522<T>::write(int address, uint8_t value) {
	address &= 0xf;
	access(address);
	switch(address) {
		case 0x0:	// Write Port B. ('ORB')
			// Store locally and communicate outwards.
			registers_.output[1] = value;

			bus_handler_.run_for(time_since_bus_handler_call_.flush<HalfCycles>());
			evaluate_port_b_output();

			registers_.interrupt_flags &= ~(InterruptFlag::CB1ActiveEdge | ((registers_.peripheral_control&0x20) ? 0 : InterruptFlag::CB2ActiveEdge));
			reevaluate_interrupts();
		break;
		case 0xf:
		case 0x1:	// Write Port A. ('ORA')
			registers_.output[0] = value;

			bus_handler_.run_for(time_since_bus_handler_call_.flush<HalfCycles>());
			bus_handler_.set_port_output(Port::A, value, registers_.data_direction[0]);

			if(handshake_modes_[1] != HandshakeMode::None) {
				set_control_line_output(Port::A, Line::Two, LineState::Off);
			}

			registers_.interrupt_flags &= ~(InterruptFlag::CA1ActiveEdge | ((registers_.peripheral_control&0x02) ? 0 : InterruptFlag::CB2ActiveEdge));
			reevaluate_interrupts();
		break;

		case 0x2:	// Port B direction ('DDRB').
			registers_.data_direction[1] = value;
		break;
		case 0x3:	// Port A direction ('DDRA').
			registers_.data_direction[0] = value;
		break;

		// Timer 1
		case 0x6:	case 0x4:	// ('T1L-L' and 'T1C-L')
			registers_.timer_latch[0] = (registers_.timer_latch[0]&0xff00) | value;
		break;
		case 0x7:	// Timer 1 latch, high ('T1L-H').
			registers_.timer_latch[0] = (registers_.timer_latch[0]&0x00ff) | uint16_t(value << 8);
		break;
		case 0x5:	// Timer 1 counter, high ('T1C-H').
			// Fill latch.
			registers_.timer_latch[0] = (registers_.timer_latch[0]&0x00ff) | uint16_t(value << 8);

			// Restart timer.
			registers_.next_timer[0] = registers_.timer_latch[0];
			timer_is_running_[0] = true;

			// If PB7 output mode is active, set it low.
			if(timer1_is_controlling_pb7()) {
				registers_.timer_port_b_output &= 0x7f;
				evaluate_port_b_output();
			}

			// Clear existing interrupt flag.
			registers_.interrupt_flags &= ~InterruptFlag::Timer1;
			reevaluate_interrupts();
		break;

		// Timer 2
		case 0x8:	// ('T2C-L')
			registers_.timer_latch[1] = value;
		break;
		case 0x9:	// ('T2C-H')
			registers_.interrupt_flags &= ~InterruptFlag::Timer2;
			registers_.next_timer[1] = registers_.timer_latch[1] | uint16_t(value << 8);
			timer_is_running_[1] = true;
			reevaluate_interrupts();
		break;

		// Shift
		case 0xa:	// ('SR')
			registers_.shift = value;
			shift_bits_remaining_ = 8;
			registers_.interrupt_flags &= ~InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		break;

		// Control
		case 0xb:	// Auxiliary control ('ACR').
			registers_.auxiliary_control = value;
			evaluate_cb2_output();

			// This is a bit of a guess: reset the timer-based PB7 output to its default high level
			// any timer that timer-linked PB7 output is disabled.
			if(!timer1_is_controlling_pb7()) {
				registers_.timer_port_b_output |= 0x80;
			}
			evaluate_port_b_output();
		break;
		case 0xc: {	// Peripheral control ('PCR').
//			const auto old_peripheral_control = registers_.peripheral_control;
			registers_.peripheral_control = value;

			int shift = 0;
			for(int port = 0; port < 2; ++port) {
				handshake_modes_[port] = HandshakeMode::None;
				switch((value >> shift) & 0x0e) {
					default: break;

					case 0x00:	// Negative interrupt input; set Cx2 interrupt on negative Cx2 transition, clear on access to Port x register.
					case 0x02:	// Independent negative interrupt input; set Cx2 interrupt on negative transition, don't clear automatically.
					case 0x04:	// Positive interrupt input; set Cx2 interrupt on positive Cx2 transition, clear on access to Port x register.
					case 0x06:	// Independent positive interrupt input; set Cx2 interrupt on positive transition, don't clear automatically.
						set_control_line_output(Port(port), Line::Two, LineState::Input);
					break;

					case 0x08:	// Handshake: set Cx2 to low on any read or write of Port x; set to high on an active transition of Cx1.
						handshake_modes_[port] = HandshakeMode::Handshake;
						set_control_line_output(Port(port), Line::Two, LineState::Off);	// At a guess.
					break;

					case 0x0a:	// Pulse output: Cx2 is low for one cycle following a read or write of Port x.
						handshake_modes_[port] = HandshakeMode::Pulse;
						set_control_line_output(Port(port), Line::Two, LineState::On);
					break;

					case 0x0c:	// Manual output: Cx2 low.
						set_control_line_output(Port(port), Line::Two, LineState::Off);
					break;

					case 0x0e:	// Manual output: Cx2 high.
						set_control_line_output(Port(port), Line::Two, LineState::On);
					break;
				}

				shift += 4;
			}
		} break;

		// Interrupt control
		case 0xd:	// Interrupt flag regiser ('IFR').
			registers_.interrupt_flags &= ~value;
			reevaluate_interrupts();
		break;
		case 0xe:	// Interrupt enable register ('IER').
			if(value&0x80)
				registers_.interrupt_enable |= value;
			else
				registers_.interrupt_enable &= ~value;
			reevaluate_interrupts();
		break;
	}
}